

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

pool_ptr<soul::heart::ProcessorInstance> __thiscall
soul::heart::Parser::findProcessorInstance(Parser *this,string *instanceName)

{
  size_type sVar1;
  long *plVar2;
  void *__s2;
  _func_int *p_Var3;
  _func_int **pp_Var4;
  _func_int *__n;
  int iVar5;
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long *plVar6;
  CompileMessage local_68;
  
  (this->
  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>)
  ._vptr_Tokeniser = (_func_int **)0x0;
  sVar1 = instanceName[4]._M_string_length;
  if (sVar1 == 0) {
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  plVar6 = *(long **)(sVar1 + 0xb8);
  plVar2 = *(long **)(sVar1 + 0xc0);
  if (plVar6 != plVar2) {
    __s2 = *(void **)in_RDX;
    p_Var3 = *(_func_int **)(in_RDX + 8);
    do {
      pp_Var4 = (_func_int **)*plVar6;
      __n = pp_Var4[4];
      if ((__n == p_Var3) &&
         ((__n == (_func_int *)0x0 || (iVar5 = bcmp(pp_Var4[3],__s2,(size_t)__n), iVar5 == 0)))) {
        (this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser = pp_Var4;
        break;
      }
      plVar6 = plVar6 + 1;
    } while (plVar6 != plVar2);
  }
  if ((this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser == (_func_int **)0x0) {
    CompileMessageHelpers::createMessage<std::__cxx11::string_const&>
              (&local_68,(CompileMessageHelpers *)0x1,none,0x2ad99c,in_RDX,in_R9);
    (**(code **)((instanceName->_M_dataplus)._M_p + 0x10))(instanceName,&local_68);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.description._M_dataplus._M_p != &local_68.description.field_2) {
      operator_delete(local_68.description._M_dataplus._M_p,
                      local_68.description.field_2._M_allocated_capacity + 1);
    }
  }
  return (pool_ptr<soul::heart::ProcessorInstance>)(ProcessorInstance *)this;
}

Assistant:

pool_ptr<heart::ProcessorInstance> findProcessorInstance (const std::string& instanceName)
    {
        pool_ptr<heart::ProcessorInstance> result;

        for (auto m : module->processorInstances)
        {
            if (m->instanceName == instanceName)
            {
                result = m;
                break;
            }
        }

        if (result == nullptr)
            throwError (Errors::cannotFindProcessor (instanceName));

        return result;
    }